

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

void __thiscall
HeadersSyncState::HeadersSyncState
          (HeadersSyncState *this,NodeId id,Params *consensus_params,CBlockIndex *chain_start,
          arith_uint256 *minimum_required_work)

{
  uint256 *puVar1;
  string_view source_file;
  base_blob<256U> *pbVar2;
  bool bVar3;
  uint uVar4;
  time_point tVar5;
  int64_t iVar6;
  Logger *pLVar7;
  Level level;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_160;
  string log_msg;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext((FastRandomContext *)&log_msg,false);
  uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                    ((RandomMixin<FastRandomContext> *)&log_msg,0x267);
  ChaCha20::~ChaCha20((ChaCha20 *)&log_msg.field_2);
  this->m_commit_offset = uVar4;
  this->m_id = id;
  this->m_consensus_params = consensus_params;
  this->m_chain_start = chain_start;
  base_uint<256U>::base_uint
            (&(this->m_minimum_required_work).super_base_uint<256U>,
             &minimum_required_work->super_base_uint<256U>);
  base_uint<256U>::base_uint
            (&(this->m_current_chain_work).super_base_uint<256U>,
             &(chain_start->nChainWork).super_base_uint<256U>);
  SaltedTxidHasher::SaltedTxidHasher(&this->m_hasher);
  bitdeque<32768>::bitdeque(&this->m_header_commitments);
  this->m_max_commitments = 0;
  this_00 = this->m_chain_start;
  CBlockIndex::GetBlockHeader(&this->m_last_header_received,this_00);
  level = (Level)this_00;
  this->m_current_height = (long)chain_start->nHeight;
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::_Deque_base
            (&(this->m_redownloaded_headers).
              super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>);
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &this->m_redownload_buffer_first_prev_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  this->m_redownload_buffer_last_height = 0;
  puVar1 = &this->m_redownload_buffer_last_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  base_uint<256U>::base_uint(&(this->m_redownload_chain_work).super_base_uint<256U>);
  this->m_process_all_remaining_headers = false;
  this->m_download_state = PRESYNC;
  tVar5 = NodeClock::now();
  iVar6 = CBlockIndex::GetMedianTimePast(chain_start);
  this->m_max_commitments =
       (((iVar6 * -1000000000 + (long)tVar5.__d.__r) / 1000000000) * 6 + 0xa8c0U) / 0x267;
  bVar3 = ::LogAcceptCategory((LogFlags)chain_start,level);
  if (bVar3) {
    base_uint<256u>::ToString_abi_cxx11_(&local_160,&this->m_minimum_required_work);
    pLVar7 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar7);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<long,long,unsigned_long,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)
                 "Initial headers sync started with peer=%d: height=%i, max_commitments=%i, min_work=%s\n"
                 ,(char *)&this->m_id,&this->m_current_height,(long *)&this->m_max_commitments,
                 (unsigned_long *)&local_160,in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pLVar7 = LogInstance();
      local_58._M_dataplus._M_p = &DAT_00000058;
      local_58._M_string_length = 0xca3033;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "HeadersSyncState";
      logging_function._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x2e,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_160);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HeadersSyncState::HeadersSyncState(NodeId id, const Consensus::Params& consensus_params,
        const CBlockIndex* chain_start, const arith_uint256& minimum_required_work) :
    m_commit_offset(FastRandomContext().randrange<unsigned>(HEADER_COMMITMENT_PERIOD)),
    m_id(id), m_consensus_params(consensus_params),
    m_chain_start(chain_start),
    m_minimum_required_work(minimum_required_work),
    m_current_chain_work(chain_start->nChainWork),
    m_last_header_received(m_chain_start->GetBlockHeader()),
    m_current_height(chain_start->nHeight)
{
    // Estimate the number of blocks that could possibly exist on the peer's
    // chain *right now* using 6 blocks/second (fastest blockrate given the MTP
    // rule) times the number of seconds from the last allowed block until
    // today. This serves as a memory bound on how many commitments we might
    // store from this peer, and we can safely give up syncing if the peer
    // exceeds this bound, because it's not possible for a consensus-valid
    // chain to be longer than this (at the current time -- in the future we
    // could try again, if necessary, to sync a longer chain).
    m_max_commitments = 6*(Ticks<std::chrono::seconds>(NodeClock::now() - NodeSeconds{std::chrono::seconds{chain_start->GetMedianTimePast()}}) + MAX_FUTURE_BLOCK_TIME) / HEADER_COMMITMENT_PERIOD;

    LogDebug(BCLog::NET, "Initial headers sync started with peer=%d: height=%i, max_commitments=%i, min_work=%s\n", m_id, m_current_height, m_max_commitments, m_minimum_required_work.ToString());
}